

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::maybeUnblockFlow(RpcConnectionState *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  undefined1 local_9;
  
  if ((this->callWordsInFlight < this->flowLimit) &&
     (pPVar1 = (this->flowWaiter).ptr.ptr, pPVar1 != (PromiseFulfiller<void> *)0x0)) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_9);
    pDVar2 = (this->flowWaiter).ptr.disposer;
    pPVar1 = (this->flowWaiter).ptr.ptr;
    (this->flowWaiter).ptr.disposer = (Disposer *)0x0;
    (this->flowWaiter).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
  }
  return;
}

Assistant:

void maybeUnblockFlow() {
    if (callWordsInFlight < flowLimit) {
      KJ_IF_SOME(w, flowWaiter) {
        w->fulfill();
        flowWaiter = kj::none;
      }
    }
  }